

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

void __thiscall ncnn::Convolution::Convolution(Convolution *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffc0;
  
  Layer::Layer(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__Convolution_009ad0f8;
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x22));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x2c));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x35));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x3e));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x47));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x50));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Convolution::Convolution()
{
    one_blob_only = true;
    support_inplace = false;
}